

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O3

int TIFFWriteDirectoryTagLongLong8Array
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint64_t *value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  uint32_t *value_00;
  long lVar5;
  char *fmt;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    return 1;
  }
  if ((tif->tif_dir).td_deferstrilearraywriting != '\0') {
    iVar3 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,0,0,0,(void *)0x0);
    return iVar3;
  }
  if ((tif->tif_flags & 0x80000) != 0) {
    if (tag == 0x117 && 1 < count) {
      uVar4 = TIFFStripSize64(tif);
    }
    else {
      if (tag != 0x145 || count < 2) goto LAB_002b8bcd;
      uVar4 = TIFFTileSize64(tif);
    }
    uVar1._0_2_ = (tif->tif_dir).td_compression;
    uVar1._2_2_ = (tif->tif_dir).td_photometric;
    iVar3 = _WriteAsType((TIFF *)(ulong)uVar1,uVar4,0xffffffff);
    if (iVar3 != 0) {
LAB_002b8bcd:
      iVar3 = TIFFWriteDirectoryTagCheckedLong8Array(tif,ndir,dir,tag,count,value);
      return iVar3;
    }
  }
  if (tag == 0x117 && 1 < count) {
    uVar4 = TIFFStripSize64(tif);
LAB_002b8c37:
    uVar2._0_2_ = (tif->tif_dir).td_compression;
    uVar2._2_2_ = (tif->tif_dir).td_photometric;
    iVar3 = _WriteAsType((TIFF *)(ulong)uVar2,uVar4,0xffff);
    if (iVar3 == 0) {
      value_00 = (uint32_t *)_TIFFmallocExt(tif,(ulong)count * 2);
      if (value_00 != (uint32_t *)0x0) {
        lVar5 = 0;
        do {
          if (0xffff < value[lVar5]) {
            fmt = "Attempt to write value larger than 0xFFFF in SHORT array.";
LAB_002b8d32:
            iVar3 = 0;
            TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array",fmt);
            goto LAB_002b8d3e;
          }
          *(short *)((long)value_00 + lVar5 * 2) = (short)value[lVar5];
          lVar5 = lVar5 + 1;
        } while (count != (uint32_t)lVar5);
        iVar3 = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,(uint16_t *)value_00);
        goto LAB_002b8d3e;
      }
      goto LAB_002b8cf8;
    }
  }
  else if (tag == 0x145 && 1 < count) {
    uVar4 = TIFFTileSize64(tif);
    goto LAB_002b8c37;
  }
  value_00 = (uint32_t *)_TIFFmallocExt(tif,(ulong)count * 4);
  if (value_00 != (uint32_t *)0x0) {
    if (count != 0) {
      lVar5 = 0;
      do {
        if (value[lVar5] >> 0x20 != 0) {
          fmt = "Attempt to write value larger than 0xFFFFFFFF in LONG array.";
          goto LAB_002b8d32;
        }
        value_00[lVar5] = (uint32_t)value[lVar5];
        lVar5 = lVar5 + 1;
      } while (count != (uint32_t)lVar5);
    }
    iVar3 = TIFFWriteDirectoryTagCheckedLongArray(tif,ndir,dir,tag,count,value_00);
LAB_002b8d3e:
    _TIFFfreeExt(tif,value_00);
    return iVar3;
  }
LAB_002b8cf8:
  TIFFErrorExtR(tif,"TIFFWriteDirectoryTagLongLong8Array","Out of memory");
  return 0;
}

Assistant:

static int TIFFWriteDirectoryTagLongLong8Array(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint32_t count, uint64_t *value)
{
    static const char module[] = "TIFFWriteDirectoryTagLongLong8Array";
    int o;
    int write_aslong4;

    /* is this just a counting pass? */
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }

    if (tif->tif_dir.td_deferstrilearraywriting)
    {
        return TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_NOTYPE, 0, 0,
                                         NULL);
    }

    if (tif->tif_flags & TIFF_BIGTIFF)
    {
        int write_aslong8 = 1;
        /* In the case of ByteCounts array, we may be able to write them on */
        /* LONG if the strip/tilesize is not too big. */
        /* Also do that for count > 1 in the case someone would want to create
         */
        /* a single-strip file with a growing height, in which case using */
        /* LONG8 will be safer. */
        if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFStripSize64(tif));
        }
        else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
        {
            write_aslong8 = WriteAsLong8(tif, TIFFTileSize64(tif));
        }
        if (write_aslong8)
        {
            return TIFFWriteDirectoryTagCheckedLong8Array(tif, ndir, dir, tag,
                                                          count, value);
        }
    }

    write_aslong4 = 1;
    if (count > 1 && tag == TIFFTAG_STRIPBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFStripSize64(tif));
    }
    else if (count > 1 && tag == TIFFTAG_TILEBYTECOUNTS)
    {
        write_aslong4 = WriteAsLong4(tif, TIFFTileSize64(tif));
    }
    if (write_aslong4)
    {
        /*
        ** For classic tiff we want to verify everything is in range for LONG
        ** and convert to long format.
        */

        uint32_t *p = _TIFFmallocExt(tif, count * sizeof(uint32_t));
        uint32_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFFFFFF)
            {
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFFFFFF "
                              "in LONG array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint32_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedLongArray(tif, ndir, dir, tag, count,
                                                  p);
        _TIFFfreeExt(tif, p);
    }
    else
    {
        uint16_t *p = _TIFFmallocExt(tif, count * sizeof(uint16_t));
        uint16_t *q;
        uint64_t *ma;
        uint32_t mb;

        if (p == NULL)
        {
            TIFFErrorExtR(tif, module, "Out of memory");
            return (0);
        }

        for (q = p, ma = value, mb = 0; mb < count; ma++, mb++, q++)
        {
            if (*ma > 0xFFFF)
            {
                /* Should not happen normally given the check we did before */
                TIFFErrorExtR(tif, module,
                              "Attempt to write value larger than 0xFFFF in "
                              "SHORT array.");
                _TIFFfreeExt(tif, p);
                return (0);
            }
            *q = (uint16_t)(*ma);
        }

        o = TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, tag, count,
                                                   p);
        _TIFFfreeExt(tif, p);
    }

    return (o);
}